

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int filevisitalt(int f,int n)

{
  int iVar1;
  char *pcVar2;
  char *bufp;
  char fname [1024];
  int n_local;
  int f_local;
  
  fname._1020_4_ = n;
  iVar1 = getbufcwd((char *)&bufp,0x400);
  if (iVar1 != 1) {
    bufp._0_1_ = 0;
  }
  pcVar2 = eread("Find alternate file: ",(char *)&bufp,0x400,0x3c);
  if (pcVar2 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar2 == '\0') {
    n_local = 0;
  }
  else {
    n_local = do_filevisitalt((char *)&bufp);
  }
  return n_local;
}

Assistant:

int
filevisitalt(int f, int n)
{
	char	 fname[NFILEN], *bufp;

	if (getbufcwd(fname, sizeof(fname)) != TRUE)
		fname[0] = '\0';
	bufp = eread("Find alternate file: ", fname, NFILEN,
	    EFNEW | EFCR | EFFILE | EFDEF);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);

	return (do_filevisitalt(fname));
}